

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O1

void xml_reporter_finish_test(TestReporter *reporter,char *filename,int line,char *message)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  size_t sVar3;
  undefined8 uVar4;
  long lVar5;
  char childData [4096];
  undefined8 local_1030;
  undefined1 local_1028 [4096];
  
  lVar2 = (long)context_stack_p;
  reporter_finish_test(reporter,filename,line,message);
  xmlFreeTextWriter(child_output_writer);
  xmlFormatProp(*(xmlNodePtr *)(&DAT_00118f78 + lVar2 * 0x28),(xmlChar *)"time","%.5f",
                (double)reporter->duration / 1000.0);
  (&context_stack_p)[lVar2 * 10] = (&context_stack_p)[lVar2 * 10] + reporter->duration;
  lVar5 = 0;
  fseek((FILE *)child_output_tmpfile,0,0);
  iVar1 = feof((FILE *)child_output_tmpfile);
  if (iVar1 == 0) {
    lVar5 = 0;
    do {
      sVar3 = fread(local_1028 + lVar5,1,0x1000 - lVar5,(FILE *)child_output_tmpfile);
      __stream = child_output_tmpfile;
      iVar1 = ferror((FILE *)child_output_tmpfile);
      if (iVar1 != 0) {
        abort();
      }
      lVar5 = lVar5 + sVar3;
      iVar1 = feof((FILE *)__stream);
    } while (iVar1 == 0);
  }
  fclose((FILE *)child_output_tmpfile);
  if (lVar5 != 0) {
    local_1028[lVar5] = 0;
    iVar1 = xmlParseBalancedChunkMemoryRecover((&output)[lVar2 * 5],0,0,0,local_1028,&local_1030,1);
    if (iVar1 != 0) {
      uVar4 = xmlNewChild(*(undefined8 *)(&DAT_00118f78 + lVar2 * 0x28),0,"error",0);
      xmlNewProp(uVar4,"type","Fatal");
      xmlNewProp(uVar4,"message",
                 "Test result XML truncated or malformed, likely from abnormal process termination")
      ;
    }
    xmlAddChildList(*(undefined8 *)(&DAT_00118f78 + lVar2 * 0x28),local_1030);
  }
  return;
}

Assistant:

static void xml_reporter_finish_test(TestReporter *reporter, const char *filename, int line, const char *message) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    FILE *out = file_stack[file_stack_p-1];

    reporter_finish_test(reporter, filename, line, message);
    memo->printer(out, " time=\"%.5f\">\n", (double)reporter->duration/(double)1000);
    if (output && strlen(output) == 0) {
        free(output);
        output = NULL;
    }

    transfer_output_from(child_output_tmpfile, memo->printer, out);

    memo->printer(out, indent(reporter));
    memo->printer(out, "</testcase>\n");
    fflush(out);
}